

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::Base64UnescapeInternal(char *src,int slen,string *dest,char *unbase64)

{
  int szsrc;
  char *src_param;
  char *dest_00;
  LogMessage *other;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  int local_38;
  int local_34;
  int len;
  int dest_len;
  char *unbase64_local;
  string *dest_local;
  char *pcStack_18;
  int slen_local;
  char *src_local;
  
  local_34 = (slen / 4) * 3 + slen % 4;
  _len = unbase64;
  unbase64_local = (char *)dest;
  dest_local._4_4_ = slen;
  pcStack_18 = src;
  std::__cxx11::string::resize((ulong)dest);
  src_param = pcStack_18;
  szsrc = dest_local._4_4_;
  dest_00 = string_as_array((string *)unbase64_local);
  local_38 = Base64UnescapeInternal(src_param,szsrc,dest_00,local_34,_len);
  if (local_38 < 0) {
    std::__cxx11::string::clear();
    src_local._7_1_ = false;
  }
  else {
    local_71 = 0;
    if (local_34 < local_38) {
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,"third_party/protobuf-lite/strutil.cc",0x819);
      local_71 = 1;
      other = internal::LogMessage::operator<<(&local_70,"CHECK failed: (len) <= (dest_len): ");
      internal::LogFinisher::operator=(local_85,other);
    }
    if ((local_71 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_70);
    }
    std::__cxx11::string::erase((ulong)unbase64_local,(long)local_38);
    src_local._7_1_ = true;
  }
  return src_local._7_1_;
}

Assistant:

static bool Base64UnescapeInternal(const char *src, int slen, std::string *dest,
                                   const signed char *unbase64) {
  // Determine the size of the output string.  Base64 encodes every 3 bytes into
  // 4 characters.  any leftover chars are added directly for good measure.
  // This is documented in the base64 RFC: http://tools.ietf.org/html/rfc3548
  const int dest_len = 3 * (slen / 4) + (slen % 4);

  dest->resize(dest_len);

  // We are getting the destination buffer by getting the beginning of the
  // string and converting it into a char *.
  const int len = Base64UnescapeInternal(src, slen, string_as_array(dest),
                                         dest_len, unbase64);
  if (len < 0) {
    dest->clear();
    return false;
  }

  // could be shorter if there was padding
  GOOGLE_DCHECK_LE(len, dest_len);
  dest->erase(len);

  return true;
}